

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O1

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int iVar2;
  int _elempack;
  _func_int *p_Var3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  _func_int **pp_Var8;
  undefined1 auVar9 [12];
  unsigned_short uVar10;
  int iVar11;
  void *pvVar12;
  uint uVar13;
  void *pvVar14;
  long lVar15;
  undefined8 *puVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  int iVar19;
  ulong uVar20;
  undefined4 *puVar21;
  int iVar22;
  size_t sVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  p_Var3 = this->_vptr_Cast_x86[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var3) == *(int *)(&this->field_0xd4 + (long)p_Var3)) {
    iVar25 = 0;
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar22 = bottom_blob->w;
      iVar19 = bottom_blob->h;
      iVar2 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar22;
      top_blob->h = iVar19;
      top_blob->d = iVar2;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
    }
  }
  else {
    iVar22 = bottom_blob->w;
    iVar19 = bottom_blob->h;
    iVar2 = bottom_blob->d;
    uVar13 = bottom_blob->c;
    iVar25 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar23 = (size_t)_elempack;
    switch(*(int *)(&this->field_0xd4 + (long)p_Var3)) {
    case 1:
      if (*(int *)(&this->field_0xd0 + (long)p_Var3) == 3) {
        Cast::forward((Cast *)((long)&this->_vptr_Cast_x86 + (long)p_Var3),bottom_blob,top_blob,opt)
        ;
      }
      sVar23 = sVar23 * 4;
      break;
    case 2:
    case 4:
      sVar23 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar23 = bottom_blob->elemsize;
    }
    switch(iVar25) {
    case 1:
      Mat::create(top_blob,iVar22,sVar23,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar22,iVar19,sVar23,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar22,iVar19,uVar13,sVar23,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar22,iVar19,iVar2,uVar13,sVar23,_elempack,opt->blob_allocator);
    }
    iVar25 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86[-3]) == 1) &&
         ((*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86[-3]) == 2 &&
          (iVar25 = bottom_blob->c, 0 < (long)iVar25)))) {
        iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        do {
          if (0 < iVar11) {
            sVar23 = top_blob->cstep;
            sVar5 = bottom_blob->cstep;
            sVar6 = top_blob->elemsize;
            pvVar12 = top_blob->data;
            sVar7 = bottom_blob->elemsize;
            pvVar14 = bottom_blob->data;
            lVar15 = 0;
            do {
              uVar10 = float32_to_float16(*(float *)((long)pvVar14 +
                                                    lVar15 * 4 + sVar5 * sVar7 * lVar26));
              *(unsigned_short *)((long)pvVar12 + lVar15 * 2 + sVar23 * sVar6 * lVar26) = uVar10;
              lVar15 = lVar15 + 1;
            } while (iVar11 != (int)lVar15);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar25);
      }
      if (((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86[-3]) == 2) &&
          (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86[-3]) == 1)) &&
         (iVar25 = bottom_blob->c, 0 < (long)iVar25)) {
        iVar11 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        do {
          if (0 < iVar11) {
            sVar23 = top_blob->cstep;
            sVar5 = bottom_blob->cstep;
            sVar6 = top_blob->elemsize;
            pvVar12 = top_blob->data;
            sVar7 = bottom_blob->elemsize;
            pvVar14 = bottom_blob->data;
            lVar15 = 0;
            do {
              fVar27 = float16_to_float32(*(unsigned_short *)
                                           ((long)pvVar14 + lVar15 * 2 + sVar5 * sVar7 * lVar26));
              *(float *)((long)pvVar12 + lVar15 * 4 + sVar23 * sVar6 * lVar26) = fVar27;
              lVar15 = lVar15 + 1;
            } while (iVar11 != (int)lVar15);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar25);
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86[-3]) == 3) &&
         (0 < (int)uVar13 && *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86[-3]) == 1)) {
        uVar24 = iVar2 * _elempack * iVar19 * iVar22;
        pvVar12 = bottom_blob->data;
        sVar23 = bottom_blob->cstep;
        pvVar14 = top_blob->data;
        sVar5 = top_blob->cstep;
        sVar6 = top_blob->elemsize;
        sVar7 = bottom_blob->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar24) {
            uVar20 = 0;
            do {
              *(float *)((long)pvVar14 + uVar20 * 4) = (float)(int)*(char *)((long)pvVar12 + uVar20)
              ;
              uVar20 = uVar20 + 1;
            } while (uVar24 != uVar20);
          }
          uVar17 = uVar17 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
          pvVar12 = (void *)((long)pvVar12 + sVar23 * sVar7);
        } while (uVar17 != uVar13);
      }
      pp_Var8 = this->_vptr_Cast_x86;
      p_Var3 = pp_Var8[-3];
      if (((*(int *)(&this->field_0xd0 + (long)p_Var3) == 1) &&
          (*(int *)(&this->field_0xd4 + (long)p_Var3) == 4)) &&
         (iVar25 = bottom_blob->c, 0 < (long)iVar25)) {
        uVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        do {
          pauVar18 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          puVar21 = (undefined4 *)
                    (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar13 < 8) {
            uVar24 = 0;
          }
          else {
            iVar22 = 7;
            do {
              auVar28 = pshuflw(*pauVar18,*pauVar18,0xed);
              auVar28 = pshufhw(auVar28,auVar28,0xed);
              auVar29 = pshuflw(pauVar18[1],pauVar18[1],0xed);
              auVar29 = pshufhw(auVar29,auVar29,0xed);
              *puVar21 = auVar28._0_4_;
              puVar21[1] = auVar28._8_4_;
              puVar21[2] = auVar29._0_4_;
              puVar21[3] = auVar29._8_4_;
              pauVar18 = pauVar18 + 2;
              puVar21 = puVar21 + 4;
              iVar22 = iVar22 + 8;
              uVar24 = uVar13 & 0xfffffff8;
            } while (iVar22 < (int)uVar13);
          }
          if (uVar13 - uVar24 != 0 && (int)uVar24 <= (int)uVar13) {
            lVar15 = 0;
            do {
              *(undefined2 *)((long)puVar21 + lVar15 * 2) =
                   *(undefined2 *)(*pauVar18 + lVar15 * 4 + 2);
              lVar15 = lVar15 + 1;
            } while (uVar13 - uVar24 != (int)lVar15);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar25);
      }
      p_Var3 = pp_Var8[-3];
      iVar25 = 0;
      if (((*(int *)(&this->field_0xd0 + (long)p_Var3) == 4) &&
          (iVar25 = 0, *(int *)(&this->field_0xd4 + (long)p_Var3) == 1)) &&
         (iVar22 = bottom_blob->c, 0 < (long)iVar22)) {
        uVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar26 = 0;
        iVar25 = 0;
        do {
          puVar16 = (undefined8 *)
                    (bottom_blob->cstep * lVar26 * bottom_blob->elemsize + (long)bottom_blob->data);
          pauVar18 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar26 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar13 < 4) {
            uVar24 = 0;
          }
          else {
            iVar19 = 3;
            do {
              uVar1 = *puVar16;
              auVar9._10_2_ = (short)((ulong)uVar1 >> 0x20);
              auVar9._0_10_ = (unkuint10)0;
              auVar28._2_12_ =
                   SUB1612(ZEXT616(CONCAT42(auVar9._8_4_,(short)((ulong)uVar1 >> 0x10))) << 0x30,4);
              auVar28._0_2_ = (short)uVar1;
              auVar28._14_2_ = 0;
              *pauVar18 = auVar28 << 0x10;
              puVar16 = puVar16 + 1;
              pauVar18 = pauVar18 + 1;
              iVar19 = iVar19 + 4;
              uVar24 = uVar13 & 0xfffffffc;
            } while (iVar19 < (int)uVar13);
          }
          if (uVar13 - uVar24 != 0 && (int)uVar24 <= (int)uVar13) {
            lVar15 = 0;
            do {
              *(uint *)((long)*pauVar18 + lVar15 * 4) =
                   (uint)*(ushort *)((long)puVar16 + lVar15 * 2) << 0x10;
              lVar15 = lVar15 + 1;
            } while (uVar13 - uVar24 != (int)lVar15);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != iVar22);
      }
    }
  }
  return iVar25;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}